

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::MessageLite::InternalSerializeWithCachedSizesToArray
          (MessageLite *this,bool deterministic,uint8 *target)

{
  int size;
  LogMessage *other;
  CodedOutputStream coded_out;
  ArrayOutputStream out;
  LogFinisher local_a1;
  CodedOutputStream local_a0;
  ArrayOutputStream local_80;
  LogMessage local_60;
  
  size = (*this->_vptr_MessageLite[0xf])();
  io::ArrayOutputStream::ArrayOutputStream(&local_80,target,size,-1);
  io::CodedOutputStream::CodedOutputStream(&local_a0,&local_80.super_ZeroCopyOutputStream);
  local_a0.serialization_deterministic_is_overridden_ = true;
  local_a0.serialization_deterministic_override_ = deterministic;
  (*this->_vptr_MessageLite[0xd])(this);
  if (local_a0.had_error_ == true) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0xef);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: !coded_out.HadError(): ");
    internal::LogFinisher::operator=(&local_a1,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  io::CodedOutputStream::~CodedOutputStream(&local_a0);
  io::ArrayOutputStream::~ArrayOutputStream(&local_80);
  return target + size;
}

Assistant:

uint8* MessageLite::InternalSerializeWithCachedSizesToArray(
    bool deterministic, uint8* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  int size = GetCachedSize();
  io::ArrayOutputStream out(target, size);
  io::CodedOutputStream coded_out(&out);
  coded_out.SetSerializationDeterministic(deterministic);
  SerializeWithCachedSizes(&coded_out);
  GOOGLE_CHECK(!coded_out.HadError());
  return target + size;
}